

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O1

Vec_Ptr_t * Aig_ManMuxesCollect(Aig_Man_t *pAig)

{
  uint uVar1;
  uint uVar2;
  Aig_Obj_t *pNode;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  pVVar6 = pAig->vObjs;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      pNode = (Aig_Obj_t *)pVVar6->pArray[lVar7];
      if (((pNode != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pNode->field_0x18 & 7) - 7)) &&
         (iVar3 = Aig_ObjIsMuxType(pNode), iVar3 != 0)) {
        uVar1 = pVVar4->nSize;
        uVar2 = pVVar4->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
            }
            iVar3 = 0x10;
          }
          else {
            iVar3 = uVar2 * 2;
            if (iVar3 <= (int)uVar2) goto LAB_006d5ab5;
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = iVar3;
        }
LAB_006d5ab5:
        pVVar4->nSize = uVar1 + 1;
        pVVar4->pArray[(int)uVar1] = pNode;
      }
      lVar7 = lVar7 + 1;
      pVVar6 = pAig->vObjs;
    } while (lVar7 < pVVar6->nSize);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Aig_ManMuxesCollect( Aig_Man_t * pAig )
{
    Vec_Ptr_t * vMuxes;
    Aig_Obj_t * pObj;
    int i;
    vMuxes = Vec_PtrAlloc( 100 );
    Aig_ManForEachNode( pAig, pObj, i )
        if ( Aig_ObjIsMuxType(pObj) )
            Vec_PtrPush( vMuxes, pObj );
    return vMuxes;
}